

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

sunrealtype N_VWrmsNorm_SensWrapper(N_Vector x,N_Vector w)

{
  long *in_RDI;
  sunrealtype tmp;
  sunrealtype nrm;
  int i;
  N_Vector in_stack_ffffffffffffffd8;
  N_Vector x_00;
  undefined4 local_14;
  
  x_00 = (N_Vector)0x0;
  for (local_14 = 0; local_14 < *(int *)(*in_RDI + 8); local_14 = local_14 + 1) {
    in_stack_ffffffffffffffd8 = (N_Vector)N_VWrmsNorm(x_00,in_stack_ffffffffffffffd8);
    if ((double)x_00 < (double)in_stack_ffffffffffffffd8) {
      x_00 = in_stack_ffffffffffffffd8;
    }
  }
  return (sunrealtype)x_00;
}

Assistant:

sunrealtype N_VWrmsNorm_SensWrapper(N_Vector x, N_Vector w)
{
  int i;
  sunrealtype nrm, tmp;

  nrm = ZERO;

  for (i = 0; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VWrmsNorm(NV_VEC_SW(x, i), NV_VEC_SW(w, i));
    if (tmp > nrm) { nrm = tmp; }
  }

  return (nrm);
}